

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QSslCertificate>::truncate
          (QGenericArrayOps<QSslCertificate> *this,char *__file,__off_t __length)

{
  QSslCertificate *pQVar1;
  QSslCertificate *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QSslCertificate> *this_00;
  
  pQVar1 = QArrayDataPointer<QSslCertificate>::begin((QArrayDataPointer<QSslCertificate> *)0x27fce1)
  ;
  this_00 = (QArrayDataPointer<QSslCertificate> *)(pQVar1 + (long)__file);
  QArrayDataPointer<QSslCertificate>::end(this_00);
  std::destroy<QSslCertificate*>((QSslCertificate *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QSslCertificate>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }